

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O0

void Min_CoverGetDisjVars(Min_Cube_t *pThis,Min_Cube_t *pCube,Vec_Int_t *vVars)

{
  uint uVar1;
  int local_2c;
  int local_28;
  int w;
  int i;
  uint uData;
  Vec_Int_t *vVars_local;
  Min_Cube_t *pCube_local;
  Min_Cube_t *pThis_local;
  
  Vec_IntClear(vVars);
  for (local_2c = 0; local_2c < (int)(*(uint *)&pCube->field_0x8 >> 10 & 0xfff);
      local_2c = local_2c + 1) {
    uVar1 = (pCube->uData[local_2c] ^ pCube->uData[local_2c] >> 1) &
            pThis->uData[local_2c] & pThis->uData[local_2c] >> 1 & 0x55555555;
    if (uVar1 != 0) {
      for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 2) {
        if ((uVar1 & 1 << ((byte)local_28 & 0x1f)) != 0) {
          Vec_IntPush(vVars,local_2c * 0x10 + local_28 / 2);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Min_CoverGetDisjVars( Min_Cube_t * pThis, Min_Cube_t * pCube, Vec_Int_t * vVars )
{
    unsigned uData;
    int i, w;
    Vec_IntClear( vVars );
    for ( w = 0; w < (int)pCube->nWords; w++ )
    {
        uData  = pThis->uData[w] & (pThis->uData[w] >> 1) & 0x55555555;
        uData &= (pCube->uData[w] ^ (pCube->uData[w] >> 1));
        if ( uData == 0 )
            continue;
        for ( i = 0; i < 32; i += 2 )
            if ( uData & (1 << i) )
                Vec_IntPush( vVars, w*16 + i/2 );
    }
}